

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verbose.c
# Opt level: O0

void print_state(int state)

{
  int state_local;
  
  if (state != 0) {
    fprintf((FILE *)verbose_file,"\n\n");
  }
  if ((SRconflicts[state] != 0) || (RRconflicts[state] != 0)) {
    print_conflicts(state);
  }
  fprintf((FILE *)verbose_file,"state %d\n",(ulong)(uint)state);
  print_core(state);
  print_nulls(state);
  print_actions(state);
  return;
}

Assistant:

void print_state(int state)
{
    if (state)
	fprintf(verbose_file, "\n\n");
    if (SRconflicts[state] || RRconflicts[state])
	print_conflicts(state);
    fprintf(verbose_file, "state %d\n", state);
    print_core(state);
    print_nulls(state);
    print_actions(state);
}